

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall
Am_Object_Data::propagate_constraint
          (Am_Object_Data *this,Am_Slot_Key key,Am_Constraint *constraint,Am_Slot_Data *proto)

{
  Am_Object_Data *local_30;
  Am_Object_Data *current;
  Am_Slot_Data *proto_local;
  Am_Constraint *constraint_local;
  Am_Slot_Key key_local;
  Am_Object_Data *this_local;
  
  for (local_30 = this->first_instance; local_30 != (Am_Object_Data *)0x0;
      local_30 = local_30->next_instance) {
    set_constraint(local_30,key,constraint,proto);
  }
  return;
}

Assistant:

void
Am_Object_Data::propagate_constraint(Am_Slot_Key key, Am_Constraint *constraint,
                                     Am_Slot_Data *proto)
{
#ifdef DEBUG
  Global_Reason_Why_Set |= Am_TRACE_INHERITANCE_PROPAGATION;
#endif
  Am_Object_Data *current = first_instance;
  while (current) {
    current->set_constraint(key, constraint, proto);
    current = current->next_instance;
  }
#ifdef DEBUG
  Global_Reason_Why_Set &= ~Am_TRACE_INHERITANCE_PROPAGATION;
#endif
}